

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O2

pair<const_int_*,_unsigned_long> __thiscall
poplar::compact_fkhash_nlm<int,_16UL>::compare
          (compact_fkhash_nlm<int,_16UL> *this,uint64_t pos,char_range *key)

{
  unsigned_long uVar1;
  pointer puVar2;
  uint8_t *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  uint64_t uVar5;
  int *piVar6;
  _Head_base<0UL,_unsigned_char_*,_false> codes;
  unsigned_long uVar7;
  ulong uVar8;
  bool bVar9;
  pair<const_int_*,_unsigned_long> pVar10;
  uint64_t alloc;
  uint64_t local_28;
  
  puVar2 = (this->chunk_ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (ulong)((uint)pos & 0xf);
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar2 + (pos >> 4));
  if ((ulong)((long)(this->chunk_ptrs_).
                    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= pos >> 4) {
    pvVar4 = &this->chunk_buf_;
  }
  codes._M_head_impl =
       (((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
        &(pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start)->super__Head_base<0UL,_unsigned_char_*,_false>).
       _M_head_impl;
  local_28 = 0;
  while( true ) {
    uVar5 = vbyte::decode(codes._M_head_impl,&local_28);
    piVar6 = (int *)(codes._M_head_impl + uVar5);
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    codes._M_head_impl = (uchar *)((long)piVar6 + local_28);
  }
  puVar3 = key->begin;
  if (puVar3 == key->end) {
    uVar7 = 0;
  }
  else {
    uVar1 = local_28 - 4;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      if (puVar3[uVar7] != codes._M_head_impl[uVar7 + uVar5]) {
        piVar6 = (int *)0x0;
        goto LAB_00119e61;
      }
    }
    if (puVar3[uVar1] == '\0') {
      uVar7 = local_28 - 3;
      piVar6 = (int *)((long)piVar6 + uVar1);
    }
    else {
      piVar6 = (int *)0x0;
      uVar7 = uVar1;
    }
  }
LAB_00119e61:
  pVar10.second = uVar7;
  pVar10.first = piVar6;
  return pVar10;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        assert(pos < size_);

        const uint8_t* char_ptr = nullptr;
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        if (chunk_id < chunk_ptrs_.size()) {
            char_ptr = chunk_ptrs_[chunk_id].get();
        } else {
            assert(chunk_id == chunk_ptrs_.size());
            char_ptr = chunk_buf_.data();
        }

        uint64_t alloc = 0;
        for (uint64_t i = 0; i < pos_in_chunk; ++i) {
            char_ptr += vbyte::decode(char_ptr, alloc);
            char_ptr += alloc;
        }
        char_ptr += vbyte::decode(char_ptr, alloc);

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(char_ptr), 0};
        }

        assert(sizeof(value_type) <= alloc);

        uint64_t length = alloc - sizeof(value_type);
        for (uint64_t i = 0; i < length; ++i) {
            if (key[i] != char_ptr[i]) {
                return {nullptr, i};
            }
        }

        if (key[length] != '\0') {
            return {nullptr, length};
        }

        // +1 considers the terminator '\0'
        return {reinterpret_cast<const value_type*>(char_ptr + length), length + 1};
    }